

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O0

bool __thiscall sf::VertexBuffer::create(VertexBuffer *this,size_t vertexCount)

{
  long lVar1;
  _func_void_GLenum_GLsizeiptrARB_void_ptr_GLenum *p_Var2;
  bool bVar3;
  GLenum GVar4;
  ostream *poVar5;
  TransientContextLock local_21;
  size_t sStack_20;
  TransientContextLock contextLock;
  size_t vertexCount_local;
  VertexBuffer *this_local;
  
  sStack_20 = vertexCount;
  bVar3 = isAvailable();
  if (bVar3) {
    GlResource::TransientContextLock::TransientContextLock(&local_21);
    if (this->m_buffer == 0) {
      (*sf_ptrc_glGenBuffersARB)(1,&this->m_buffer);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0x89,"GLEXT_glGenBuffers(1, &m_buffer)");
    }
    this_local._7_1_ = this->m_buffer != 0;
    if (this_local._7_1_) {
      (*sf_ptrc_glBindBufferARB)(0x8892,this->m_buffer);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0x91,"GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer)");
      p_Var2 = sf_ptrc_glBufferDataARB;
      lVar1 = sStack_20 * 0x14;
      GVar4 = anon_unknown.dwarf_e46a5::usageToGlEnum(this->m_usage);
      (*p_Var2)(0x8892,lVar1,(void *)0x0,GVar4);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0x92,
                         "GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, sizeof(Vertex) * vertexCount, 0, usageToGlEnum(m_usage))"
                        );
      (*sf_ptrc_glBindBufferARB)(0x8892,0);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0x93,"GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0)");
      this->m_size = sStack_20;
    }
    else {
      poVar5 = err();
      poVar5 = std::operator<<(poVar5,"Could not create vertex buffer, generation failed");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    GlResource::TransientContextLock::~TransientContextLock(&local_21);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool VertexBuffer::create(std::size_t vertexCount)
{
    if (!isAvailable())
        return false;

    TransientContextLock contextLock;

    if (!m_buffer)
        glCheck(GLEXT_glGenBuffers(1, &m_buffer));

    if (!m_buffer)
    {
        err() << "Could not create vertex buffer, generation failed" << std::endl;
        return false;
    }

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer));
    glCheck(GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, sizeof(Vertex) * vertexCount, 0, usageToGlEnum(m_usage)));
    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0));

    m_size = vertexCount;

    return true;
}